

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

void MIR_output_op(MIR_context_t ctx,FILE *f,MIR_op_t op,MIR_func_t func)

{
  MIR_module_t pMVar1;
  undefined8 uVar2;
  long lVar3;
  MIR_item_t_conflict item;
  MIR_str_t str;
  MIR_alias_t alias;
  undefined4 uVar4;
  undefined4 uVar5;
  char *pcVar6;
  reg_desc_t *prVar7;
  undefined8 uVar8;
  MIR_func_t func_00;
  MIR_reg_t MVar9;
  char *__format;
  MIR_context_t pMVar10;
  code *pcVar11;
  
  pMVar10 = ctx;
  while (op._8_1_ == '\f') {
    lVar3 = CONCAT44(op.u.mem.alias,CONCAT22(op.u.reg._2_2_,CONCAT11(op.u.mem.scale,op.u.reg._0_1_))
                    );
    pMVar10 = (MIR_context_t)&DAT_0000004c;
    fputc(0x4c,(FILE *)f);
    uVar8 = *(undefined8 *)(lVar3 + 0x30);
    uVar2 = *(undefined8 *)(lVar3 + 0x38);
    op.u.mem.disp = *(MIR_disp_t *)(lVar3 + 0x48);
    op.u.reg._0_1_ = (undefined1)uVar8;
    op.u.mem.scale = (MIR_scale_t)((ulong)uVar8 >> 8);
    op.u.reg._2_2_ = (undefined2)((ulong)uVar8 >> 0x10);
    op.u.mem.alias = (MIR_alias_t)((ulong)uVar8 >> 0x20);
    op.u.mem.nonalias._0_2_ = (undefined2)uVar2;
    op.u.mem.nonalias._2_2_ = (undefined2)((ulong)uVar2 >> 0x10);
    op.u.mem.nloc = (uint32_t)((ulong)uVar2 >> 0x20);
    op.u.mem.base = (MIR_reg_t)*(undefined8 *)(lVar3 + 0x40);
    op.u.mem.index = (MIR_reg_t)((ulong)*(undefined8 *)(lVar3 + 0x40) >> 0x20);
    op._8_2_ = SUB82(*(undefined8 *)(lVar3 + 0x28),0);
  }
  switch(op._8_1_) {
  case '\x01':
    prVar7 = find_rd_by_reg(ctx,CONCAT22(op.u.reg._2_2_,CONCAT11(op.u.mem.scale,op.u.reg._0_1_)),
                            func);
    pcVar6 = prVar7->name;
    goto LAB_00139333;
  case '\x02':
    output_var(ctx,f,func,CONCAT22(op.u.reg._2_2_,CONCAT11(op.u.mem.scale,op.u.reg._0_1_)));
    return;
  case '\x03':
    __format = "%ld";
    break;
  case '\x04':
    __format = "%lu";
    break;
  case '\x05':
    pcVar6 = "%.*ef";
    uVar8 = 0x18;
    goto LAB_00139381;
  case '\x06':
    pcVar6 = "%.*e";
    uVar8 = 0x35;
LAB_00139381:
    fprintf((FILE *)f,pcVar6,uVar8);
    return;
  case '\a':
    fprintf((FILE *)f,"%.*LeL",0x40);
    return;
  case '\b':
    item = (MIR_item_t_conflict)
           CONCAT44(op.u.mem.alias,CONCAT22(op.u.reg._2_2_,CONCAT11(op.u.mem.scale,op.u.reg._0_1_)))
    ;
    pMVar1 = item->module;
    if (pMVar1 != func->func_item->module) {
      pMVar10 = (MIR_context_t)f;
      fprintf((FILE *)f,"%s.",pMVar1->name);
    }
    pcVar6 = MIR_item_name(pMVar10,item);
LAB_00139333:
    fputs(pcVar6,(FILE *)f);
    return;
  case '\t':
    str.len._1_1_ = op.u.mem.scale;
    str.len._0_1_ = op.u.reg._0_1_;
    str.len._2_2_ = op.u.reg._2_2_;
    str.len._4_4_ = op.u.mem.alias;
    str.s._0_2_ = op.u.mem.nonalias._0_2_;
    str.s._2_2_ = op.u.mem.nonalias._2_2_;
    str.s._4_4_ = op.u.mem.nloc;
    MIR_output_str(pMVar10,f,str);
    return;
  case '\n':
  case '\v':
    pcVar6 = type_str(ctx,(uint)(byte)op.u.reg._0_1_);
    if (*pcVar6 == '\0') {
      pcVar6 = "MIR_type_str: wrong type";
      pMVar10 = (MIR_context_t)0xb;
      (*ctx->error_func)(MIR_wrong_param_value_error,"MIR_type_str: wrong type");
      prVar7 = find_rd_by_reg(pMVar10,(MIR_reg_t)ctx,func_00);
      fputs(prVar7->name,(FILE *)pcVar6);
      return;
    }
    MVar9 = -(uint)((op._8_2_ & 0xff) != 10);
    fputs(pcVar6,(FILE *)f);
    fputc(0x3a,(FILE *)f);
    uVar5 = op.u.mem.index;
    uVar4 = op.u.mem.base;
    if ((op.u.mem.disp != 0) ||
       (uVar5 = MVar9, uVar4 = MVar9, op.u.mem.index == MVar9 && op.u.mem.base == MVar9)) {
      op.u.mem.base = uVar4;
      fprintf((FILE *)f,"%ld");
      op.u.mem.index = uVar5;
    }
    if (op.u.mem.index != MVar9 || op.u.mem.base != MVar9) {
      fputc(0x28,(FILE *)f);
      if (op.u.mem.base != MVar9) {
        pcVar11 = output_var;
        if ((op._8_2_ & 0xff) == 10) {
          pcVar11 = output_reg;
        }
        (*pcVar11)(ctx,f,func,op.u.mem.base);
      }
      if (op.u.mem.index != MVar9) {
        fwrite(", ",2,1,(FILE *)f);
        pcVar11 = output_var;
        if ((op._8_2_ & 0xff) == 10) {
          pcVar11 = output_reg;
        }
        (*pcVar11)(ctx,f,func,op.u.mem.index);
        if (op.u.mem.scale != 1) {
          fwrite(", ",2,1,(FILE *)f);
          fprintf((FILE *)f,"%u",(ulong)(uint)op.u.mem.scale);
        }
      }
      fputc(0x29,(FILE *)f);
    }
    alias = CONCAT22(op.u.mem.nonalias._2_2_,op.u.mem.nonalias._0_2_);
    if (op.u.mem.alias == 0 && alias == 0) {
      return;
    }
    fputc(0x3a,(FILE *)f);
    if (op.u.mem.alias != 0) {
      pcVar6 = MIR_alias_name(ctx,op.u.mem.alias);
      fputs(pcVar6,(FILE *)f);
    }
    if (alias == 0) {
      return;
    }
    pcVar6 = MIR_alias_name(ctx,alias);
    __format = ":%s";
    goto LAB_00139553;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0xb95,"void MIR_output_op(MIR_context_t, FILE *, MIR_op_t, MIR_func_t)");
  }
  pcVar6 = (char *)CONCAT44(op.u.mem.alias,
                            CONCAT22(op.u.reg._2_2_,CONCAT11(op.u.mem.scale,op.u.reg._0_1_)));
LAB_00139553:
  fprintf((FILE *)f,__format,pcVar6);
  return;
}

Assistant:

void MIR_output_op (MIR_context_t ctx, FILE *f, MIR_op_t op, MIR_func_t func) {
  switch (op.mode) {
  case MIR_OP_REG: output_reg (ctx, f, func, op.u.reg); break;
  case MIR_OP_VAR: output_var (ctx, f, func, op.u.var); break;
  case MIR_OP_INT: fprintf (f, "%" PRId64, op.u.i); break;
  case MIR_OP_UINT: fprintf (f, "%" PRIu64, op.u.u); break;
  case MIR_OP_FLOAT: fprintf (f, "%.*ef", FLT_MANT_DIG, op.u.f); break;
  case MIR_OP_DOUBLE: fprintf (f, "%.*e", DBL_MANT_DIG, op.u.d); break;
  case MIR_OP_LDOUBLE: fprintf (f, "%.*LeL", LDBL_MANT_DIG, op.u.ld); break;
  case MIR_OP_MEM:
  case MIR_OP_VAR_MEM: {
    MIR_reg_t no_reg = op.mode == MIR_OP_MEM ? 0 : MIR_NON_VAR;

    output_type (ctx, f, op.u.mem.type);
    fprintf (f, ":");
    if (op.u.mem.disp != 0 || (op.u.mem.base == no_reg && op.u.mem.index == no_reg))
      output_disp (f, op.u.mem.disp);
    if (op.u.mem.base != no_reg || op.u.mem.index != no_reg) {
      fprintf (f, "(");
      if (op.u.mem.base != no_reg)
        (op.mode == MIR_OP_MEM ? output_reg : output_var) (ctx, f, func, op.u.mem.base);
      if (op.u.mem.index != no_reg) {
        fprintf (f, ", ");
        (op.mode == MIR_OP_MEM ? output_reg : output_var) (ctx, f, func, op.u.mem.index);
        if (op.u.mem.scale != 1) {
          fprintf (f, ", ");
          output_scale (f, op.u.mem.scale);
        }
      }
      fprintf (f, ")");
    }
    if (op.u.mem.alias != 0 || op.u.mem.nonalias != 0) {
      fprintf (f, ":");
      if (op.u.mem.alias != 0) fprintf (f, "%s", MIR_alias_name (ctx, op.u.mem.alias));
      if (op.u.mem.nonalias != 0) fprintf (f, ":%s", MIR_alias_name (ctx, op.u.mem.nonalias));
    }
    break;
  }
  case MIR_OP_REF:
    if (op.u.ref->module != func->func_item->module) fprintf (f, "%s.", op.u.ref->module->name);
    fprintf (f, "%s", MIR_item_name (ctx, op.u.ref));
    break;
  case MIR_OP_STR: MIR_output_str (ctx, f, op.u.str); break;
  case MIR_OP_LABEL: output_label (ctx, f, func, op.u.label); break;
  default: mir_assert (FALSE);
  }
}